

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

QWidget * __thiscall
QLineEditPrivate::addAction
          (QLineEditPrivate *this,QAction *newAction,QAction *before,ActionPosition position,
          int flags)

{
  bool bVar1;
  qsizetype qVar2;
  QWidgetAction *slot;
  reference pSVar3;
  ActionPosition in_ECX;
  QAction *in_RDX;
  QAction *in_RSI;
  QLineEditPrivate *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  SideWidgetEntryList *list;
  SideWidgetEntry *e;
  SideWidgetEntryList *__range2;
  QLineEditIconButton *toolButton;
  QWidgetAction *widgetAction;
  QWidget *w;
  QLineEdit *q;
  SideWidgetLocation location;
  iterator __end2;
  iterator __begin2;
  code *in_stack_fffffffffffffe88;
  QLineEditPrivate *in_stack_fffffffffffffe90;
  QLineEdit *in_stack_fffffffffffffe98;
  QAbstractButton *in_stack_fffffffffffffea0;
  QWidget *this_00;
  const_iterator __position;
  QLineEditPrivate *in_stack_fffffffffffffeb8;
  QLineEditPrivate *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  byte in_stack_fffffffffffffecf;
  undefined8 in_stack_fffffffffffffee0;
  ConnectionType type;
  Object *in_stack_fffffffffffffee8;
  Object *in_stack_fffffffffffffef0;
  Function in_stack_ffffffffffffff10;
  QLineEditPrivate *local_e8;
  code *in_stack_ffffffffffffff20;
  uint local_c8;
  QAction *local_c0;
  QLineEditPrivate *local_a8;
  SideWidgetLocation local_88;
  SideWidgetEntry *local_80;
  __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
  local_78;
  code *local_70;
  undefined8 local_68;
  Connection local_60;
  QIcon local_58;
  QString local_50;
  code *local_38;
  undefined8 local_30;
  Connection local_28;
  SideWidgetEntry local_20;
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RSI == (QAction *)0x0) {
    local_a8 = (QLineEditPrivate *)0x0;
  }
  else {
    bVar1 = hasSideWidgets(in_stack_fffffffffffffe90);
    if (!bVar1) {
      in_stack_ffffffffffffff20 = QLineEdit::textChanged;
      local_38 = textChanged;
      local_30 = 0;
      in_stack_fffffffffffffe88 = textChanged;
      in_stack_fffffffffffffe90 = (QLineEditPrivate *)0x0;
      QObjectPrivate::
      connect<void(QLineEdit::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
                ((Object *)in_stack_fffffffffffffef0,
                 (offset_in_QLineEdit_to_subr)QLineEdit::textChanged,in_stack_fffffffffffffee8,
                 in_stack_ffffffffffffff10,type);
      QMetaObject::Connection::~Connection(&local_28);
      QLineEdit::text(in_stack_fffffffffffffe98);
      qVar2 = QString::size(&local_50);
      in_RDI->lastTextSize = (int)qVar2;
      QString::~QString((QString *)0x5d42f0);
    }
    local_e8 = (QLineEditPrivate *)0x0;
    slot = qobject_cast<QWidgetAction*>((QObject *)0x5d4309);
    local_c8 = in_R8D;
    if ((slot != (QWidgetAction *)0x0) &&
       (local_e8 = (QLineEditPrivate *)
                   QWidgetAction::requestWidget
                             ((QWidgetAction *)
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                              (QWidget *)in_stack_fffffffffffffec0),
       local_e8 != (QLineEditPrivate *)0x0)) {
      local_c8 = in_R8D | 2;
    }
    if (local_e8 == (QLineEditPrivate *)0x0) {
      local_e8 = (QLineEditPrivate *)operator_new(0x38);
      QLineEditIconButton::QLineEditIconButton
                ((QLineEditIconButton *)in_stack_fffffffffffffe90,
                 (QWidget *)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffeb8 = local_e8;
      QAction::icon();
      QAbstractButton::setIcon(in_stack_fffffffffffffea0,(QIcon *)in_stack_fffffffffffffe98);
      QIcon::~QIcon(&local_58);
      in_stack_fffffffffffffecf = 1;
      if (in_RDI->lastTextSize < 1) {
        in_stack_fffffffffffffecf = (local_c8 & 1) != 0 ^ 0xff;
      }
      in_stack_fffffffffffffec0 = local_e8;
      QLineEditIconButton::setOpacity
                ((QLineEditIconButton *)in_stack_fffffffffffffe90,(qreal)in_stack_fffffffffffffe88);
      if ((local_c8 & 4) != 0) {
        local_70 = clearButtonClicked;
        local_68 = 0;
        in_stack_fffffffffffffe88 = clearButtonClicked;
        in_stack_fffffffffffffe90 = (QLineEditPrivate *)0x0;
        QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QLineEditPrivate::*)()>
                  (in_stack_fffffffffffffef0,
                   (offset_in_QAbstractButton_to_subr)in_stack_ffffffffffffff20,
                   in_stack_fffffffffffffee8,(Function)slot,type);
        QMetaObject::Connection::~Connection(&local_60);
        QLineEditIconButton::setHideWithText((QLineEditIconButton *)local_e8,true);
      }
      QToolButton::setDefaultAction((QToolButton *)in_stack_fffffffffffffec0,in_RSI);
    }
    local_c0 = in_RDX;
    if (((in_RDX == (QAction *)0x0) && ((local_c8 & 4) == 0)) && (in_ECX == TrailingPosition)) {
      local_78._M_current = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._M_current =
           (SideWidgetEntry *)
           std::
           vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    *)in_stack_fffffffffffffe90);
      local_80 = (SideWidgetEntry *)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = (SideWidgetEntry *)
                 std::
                 vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                 ::end((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                        *)in_stack_fffffffffffffe90);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                                 *)in_stack_fffffffffffffe90,
                                (__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                                 *)in_stack_fffffffffffffe88), bVar1) {
        pSVar3 = __gnu_cxx::
                 __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                 ::operator*(&local_78);
        if ((pSVar3->flags & 4U) != 0) {
          local_c0 = pSVar3->action;
          break;
        }
        __gnu_cxx::
        __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
        ::operator++(&local_78);
      }
    }
    local_88 = (SideWidgetLocation)&DAT_aaaaaaaaaaaaaaaa;
    if (local_c0 == (QAction *)0x0) {
      local_88.index = -1;
      local_88.position = in_ECX;
    }
    else {
      local_88 = findSideWidget(in_stack_fffffffffffffec0,(QAction *)in_stack_fffffffffffffeb8);
    }
    if (local_88.position == TrailingPosition) {
      this_00 = (QWidget *)&in_RDI->trailingSideWidgets;
    }
    else {
      this_00 = (QWidget *)&in_RDI->leadingSideWidgets;
    }
    __position._M_current = (SideWidgetEntry *)this_00;
    bVar1 = SideWidgetLocation::isValid(&local_88);
    if (bVar1) {
      std::
      vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               *)in_stack_fffffffffffffe90);
      __gnu_cxx::
      __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
      ::operator+((__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                   *)in_stack_fffffffffffffe98,(difference_type)in_stack_fffffffffffffe90);
    }
    else {
      std::
      vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ::end((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             *)in_stack_fffffffffffffe90);
    }
    __gnu_cxx::
    __normal_iterator<QLineEditPrivate::SideWidgetEntry_const*,std::vector<QLineEditPrivate::SideWidgetEntry,std::allocator<QLineEditPrivate::SideWidgetEntry>>>
    ::__normal_iterator<QLineEditPrivate::SideWidgetEntry*>
              ((__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                *)in_stack_fffffffffffffe90,
               (__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                *)in_stack_fffffffffffffe88);
    SideWidgetEntry::SideWidgetEntry(&local_20,(QWidget *)local_e8,in_RSI,local_c8);
    std::
    vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>::
    insert((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
            *)in_stack_fffffffffffffe90,__position,(value_type *)in_stack_fffffffffffffe88);
    positionSideWidgets((QLineEditPrivate *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    QWidget::show(this_00);
    local_a8 = local_e8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QWidget *)local_a8;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QLineEditPrivate::addAction(QAction *newAction, QAction *before, QLineEdit::ActionPosition position, int flags)
{
    Q_Q(QLineEdit);
    if (!newAction)
        return nullptr;
    if (!hasSideWidgets()) { // initial setup.
        QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                this, &QLineEditPrivate::textChanged);
        lastTextSize = q->text().size();
    }
    QWidget *w = nullptr;
    // Store flags about QWidgetAction here since removeAction() may be called from ~QAction,
    // in which a qobject_cast<> no longer works.
    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(newAction)) {
        if ((w = widgetAction->requestWidget(q)))
            flags |= SideWidgetCreatedByWidgetAction;
    }
    if (!w) {
#if QT_CONFIG(toolbutton)
        QLineEditIconButton *toolButton = new QLineEditIconButton(q);
        toolButton->setIcon(newAction->icon());
        toolButton->setOpacity(lastTextSize > 0 || !(flags & SideWidgetFadeInWithText) ? 1 : 0);
        if (flags & SideWidgetClearButton) {
            QObjectPrivate::connect(toolButton, &QToolButton::clicked,
                                    this, &QLineEditPrivate::clearButtonClicked);

#if QT_CONFIG(animation)
            // The clear button is handled only by this widget. The button should be really
            // shown/hidden in order to calculate size hints correctly.
            toolButton->setHideWithText(true);
#endif
        }
        toolButton->setDefaultAction(newAction);
        w = toolButton;
#else
        return nullptr;
#endif
    }

    // QTBUG-59957: clear button should be the leftmost action.
    if (!before && !(flags & SideWidgetClearButton) && position == QLineEdit::TrailingPosition) {
        for (const SideWidgetEntry &e : trailingSideWidgets) {
            if (e.flags & SideWidgetClearButton) {
                before = e.action;
                break;
            }
        }
    }

    // If there is a 'before' action, it takes preference

    // There's a bug in GHS compiler that causes internal error on the following code.
    // The affected GHS compiler versions are 2016.5.4 and 2017.1. GHS internal reference
    // to track the progress of this issue is TOOLS-26637.
    // This temporary workaround allows to compile with GHS toolchain and should be
    // removed when GHS provides a patch to fix the compiler issue.

#if defined(Q_CC_GHS)
    const SideWidgetLocation loc = {position, -1};
    const auto location = before ? findSideWidget(before) : loc;
#else
    const auto location = before ? findSideWidget(before) : SideWidgetLocation{position, -1};
#endif

    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    list.insert(location.isValid() ? list.begin() + location.index : list.end(),
                SideWidgetEntry(w, newAction, flags));
    positionSideWidgets();
    w->show();
    return w;
}